

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_reciprocal>
              (Mat *a,Option *opt)

{
  long lVar1;
  int iVar2;
  long *in_RDI;
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_reciprocal op;
  Mat *m;
  int local_37c;
  undefined1 (*local_330) [64];
  int local_328;
  
  lVar1 = in_RDI[7];
  iVar2 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
          (int)in_RDI[3];
  for (local_328 = 0; local_328 < (int)lVar1; local_328 = local_328 + 1) {
    local_330 = (undefined1 (*) [64])(*in_RDI + in_RDI[8] * (long)local_328 * in_RDI[2]);
    for (local_37c = 0; local_37c + 0xf < iVar2; local_37c = local_37c + 0x10) {
      auVar3 = vdivps_avx512f((undefined1  [64])::_ps512_1,*local_330);
      *local_330 = auVar3;
      local_330 = local_330 + 1;
    }
    for (; local_37c + 7 < iVar2; local_37c = local_37c + 8) {
      auVar5._8_4_ = 0x3f800000;
      auVar5._0_8_ = 0x3f8000003f800000;
      auVar5._12_4_ = 0x3f800000;
      auVar5._16_4_ = 0x3f800000;
      auVar5._20_4_ = 0x3f800000;
      auVar5._24_4_ = 0x3f800000;
      auVar5._28_4_ = 0x3f800000;
      auVar5 = vdivps_avx(auVar5,*(undefined1 (*) [32])*local_330);
      *(undefined1 (*) [32])*local_330 = auVar5;
      local_330 = (undefined1 (*) [64])(*local_330 + 0x20);
    }
    for (; local_37c + 3 < iVar2; local_37c = local_37c + 4) {
      auVar4._8_4_ = 0x3f800000;
      auVar4._0_8_ = 0x3f8000003f800000;
      auVar4._12_4_ = 0x3f800000;
      auVar4 = vdivps_avx(auVar4,*(undefined1 (*) [16])*local_330);
      *(undefined1 (*) [16])*local_330 = auVar4;
      local_330 = (undefined1 (*) [64])(*local_330 + 0x10);
    }
    for (; local_37c < iVar2; local_37c = local_37c + 1) {
      *(float *)*local_330 = 1.0 / *(float *)*local_330;
      local_330 = (undefined1 (*) [64])(*local_330 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}